

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall QTreeViewPrivate::initialize(QTreeViewPrivate *this)

{
  QWidget *this_00;
  void *pvVar1;
  int iVar2;
  QHeaderView *this_01;
  QStyle *pQVar3;
  long in_FS_OFFSET;
  void *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  updateIndentationFromStyle(this);
  QFramePrivate::updateStyledFrameWidths((QFramePrivate *)this);
  QAbstractItemView::setSelectionBehavior((QAbstractItemView *)this_00,SelectRows);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this_00,SingleSelection);
  QAbstractItemView::setHorizontalScrollMode((QAbstractItemView *)this_00,ScrollPerPixel);
  QWidget::setAttribute(this_00,WA_MacShowFocusRect,true);
  this_01 = (QHeaderView *)operator_new(0x28);
  QHeaderView::QHeaderView(this_01,Horizontal,this_00);
  QHeaderView::setSectionsMovable(this_01,true);
  QHeaderView::setStretchLastSection(this_01,true);
  QHeaderView::setDefaultAlignment(this_01,(Alignment)0x81);
  QTreeView::setHeader((QTreeView *)this_00,this_01);
  pQVar3 = QWidget::style(this_00);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x71,0,this_00,0);
  this->animationsEnabled = 0 < iVar2;
  QObjectPrivate::connect<void(QAbstractAnimation::*)(),void(QTreeViewPrivate::*)()>
            ((Object *)&local_30,(offset_in_QAbstractAnimation_to_subr)&this->animatedOperation,
             (Object *)QAbstractAnimation::finished,0,(ConnectionType)this);
  pvVar1 = (this->animationConnection).d_ptr;
  (this->animationConnection).d_ptr = local_30;
  local_30 = pvVar1;
  QMetaObject::Connection::~Connection((Connection *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::initialize()
{
    Q_Q(QTreeView);

    updateIndentationFromStyle();
    updateStyledFrameWidths();
    q->setSelectionBehavior(QAbstractItemView::SelectRows);
    q->setSelectionMode(QAbstractItemView::SingleSelection);
    q->setHorizontalScrollMode(QAbstractItemView::ScrollPerPixel);
    q->setAttribute(Qt::WA_MacShowFocusRect);

    QHeaderView *header = new QHeaderView(Qt::Horizontal, q);
    header->setSectionsMovable(true);
    header->setStretchLastSection(true);
    header->setDefaultAlignment(Qt::AlignLeft|Qt::AlignVCenter);
    q->setHeader(header);
#if QT_CONFIG(animation)
    animationsEnabled = q->style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, q) > 0;
    animationConnection =
        QObjectPrivate::connect(&animatedOperation, &QVariantAnimation::finished,
                                this, &QTreeViewPrivate::endAnimatedOperation);
#endif // animation
}